

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O1

void __thiscall QTextDocumentPrivate::finishEdit(QTextDocumentPrivate *this)

{
  quint32 _t1;
  QTextDocument *this_00;
  QTextCursorPrivate *d;
  ulong uVar1;
  bool bVar2;
  int in_ECX;
  int in_EDX;
  ulong uVar3;
  int in_ESI;
  long lVar4;
  Data *pDVar5;
  QTextCursor *cursor;
  QTextCursor *_t1_00;
  long in_FS_OFFSET;
  QTextCursor local_60;
  QArrayDataPointer<QTextCursor> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->editBlock != 0) goto LAB_004dbc86;
  this_00 = *(QTextDocument **)&this->field_0x8;
  if (this->framesDirty == true) {
    scan_frames(this,in_ESI,in_EDX,in_ECX);
  }
  if ((this->lout != (QAbstractTextDocumentLayout *)0x0) && (-1 < this->docChangeFrom)) {
    if (this->inContentsChange == false) {
      this->inContentsChange = true;
      QTextDocument::contentsChange
                (this_00,this->docChangeFrom,this->docChangeOldLength,this->docChangeLength);
      this->inContentsChange = false;
    }
    (**(code **)(*(long *)this->lout + 0x90))
              (this->lout,this->docChangeFrom,this->docChangeOldLength,this->docChangeLength);
  }
  this->docChangeFrom = -1;
  if ((this->field_0x294 & 1) != 0) {
    this->field_0x294 = this->field_0x294 & 0xfe;
    bVar2 = ensureMaximumBlockCount(this);
    if (bVar2) goto LAB_004dbc86;
  }
  local_58.d = (Data *)0x0;
  local_58.ptr = (QTextCursor *)0x0;
  local_58.size = 0;
  pDVar5 = (this->cursors).q_hash.d;
  if (pDVar5 == (Data *)0x0) {
    pDVar5 = (Data *)0x0;
LAB_004dbb54:
    uVar3 = 0;
  }
  else {
    if (pDVar5->spans->offsets[0] != 0xff) goto LAB_004dbb54;
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      if (pDVar5->numBuckets == uVar3) {
        pDVar5 = (Data *)0x0;
        uVar3 = 0;
        break;
      }
      uVar1 = uVar3 + 1;
    } while (pDVar5->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
  }
  if (pDVar5 != (Data *)0x0 || uVar3 != 0) {
    do {
      d = *(QTextCursorPrivate **)
           pDVar5->spans[uVar3 >> 7].entries[pDVar5->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f]].
           storage.data;
      if ((d->field_0x28 & 4) != 0) {
        d->field_0x28 = d->field_0x28 & 0xfb;
        QTextCursor::QTextCursor(&local_60,d);
        QtPrivate::QMovableArrayOps<QTextCursor>::emplace<QTextCursor>
                  ((QMovableArrayOps<QTextCursor> *)&local_58,local_58.size,&local_60);
        QList<QTextCursor>::end((QList<QTextCursor> *)&local_58);
        QTextCursor::~QTextCursor(&local_60);
      }
      do {
        if (pDVar5->numBuckets - 1 == uVar3) {
          pDVar5 = (Data *)0x0;
          uVar3 = 0;
          break;
        }
        uVar3 = uVar3 + 1;
      } while (pDVar5->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
    } while ((pDVar5 != (Data *)0x0) || (uVar3 != 0));
  }
  if (local_58.size != 0) {
    lVar4 = local_58.size << 3;
    _t1_00 = local_58.ptr;
    do {
      QTextDocument::cursorPositionChanged(this_00,_t1_00);
      _t1_00 = _t1_00 + 1;
      lVar4 = lVar4 + -8;
    } while (lVar4 != 0);
  }
  contentsChanged(this);
  _t1 = ((this->blocks).data.field_0.head)->node_count;
  if (_t1 != this->lastBlockCount) {
    this->lastBlockCount = _t1;
    QTextDocument::blockCountChanged(this_00,_t1);
  }
  if ((this->undoEnabled == false) && (this->unreachableCharacterCount != 0)) {
    compressPieceTable(this);
  }
  QArrayDataPointer<QTextCursor>::~QArrayDataPointer(&local_58);
LAB_004dbc86:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::finishEdit()
{
    Q_Q(QTextDocument);

    if (editBlock)
        return;

    if (framesDirty)
        scan_frames(docChangeFrom, docChangeOldLength, docChangeLength);

    if (lout && docChangeFrom >= 0) {
        if (!inContentsChange) {
            QScopedValueRollback<bool> bg(inContentsChange, true);
            emit q->contentsChange(docChangeFrom, docChangeOldLength, docChangeLength);
        }
        lout->documentChanged(docChangeFrom, docChangeOldLength, docChangeLength);
    }

    docChangeFrom = -1;

    if (needsEnsureMaximumBlockCount) {
        needsEnsureMaximumBlockCount = false;
        if (ensureMaximumBlockCount()) {
            // if ensureMaximumBlockCount() returns true
            // it will have called endEditBlock() and
            // compressPieceTable() itself, so we return here
            // to prevent getting two contentsChanged emits
            return;
        }
    }

    QList<QTextCursor> changedCursors;
    for (QTextCursorPrivate *curs : std::as_const(cursors)) {
        if (curs->changed) {
            curs->changed = false;
            changedCursors.append(QTextCursor(curs));
        }
    }
    for (const QTextCursor &cursor : std::as_const(changedCursors))
        emit q->cursorPositionChanged(cursor);

    contentsChanged();

    if (blocks.numNodes() != lastBlockCount) {
        lastBlockCount = blocks.numNodes();
        emit q->blockCountChanged(lastBlockCount);
    }

    if (!undoEnabled && unreachableCharacterCount)
        compressPieceTable();
}